

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

AutoFile * __thiscall
AutoFile::operator>>(AutoFile *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *obj)

{
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  AutoFile *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  
  v = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  Unserialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>(unaff_retaddr,v);
  if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) == v) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return *this;
    }